

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O3

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validatePooling3dLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  bool bVar3;
  LayerUnion from;
  Pooling3DLayerParams pooling3d;
  string local_e8;
  undefined1 local_c8 [8];
  _Alloc_hider local_c0;
  undefined1 local_b8 [24];
  undefined1 local_a0 [8];
  _Alloc_hider local_98;
  int local_8c;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  int local_60;
  Pooling3DLayerParams_Pooling3DPaddingType local_58;
  string local_50;
  
  Result::Result(__return_storage_ptr__);
  validateInputCount((Result *)local_a0,layer,1,1);
  __return_storage_ptr__->m_type = local_a0._0_4_;
  __return_storage_ptr__->m_reason = local_a0._4_4_;
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_p != &local_88) {
    operator_delete(local_98._M_p,
                    CONCAT44(local_88._M_allocated_capacity._4_4_,
                             local_88._M_allocated_capacity._0_4_) + 1);
  }
  bVar3 = Result::good(__return_storage_ptr__);
  if (bVar3) {
    validateOutputCount((Result *)local_a0,layer,1,1);
    __return_storage_ptr__->m_type = local_a0._0_4_;
    __return_storage_ptr__->m_reason = local_a0._4_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_p != &local_88) {
      operator_delete(local_98._M_p,
                      CONCAT44(local_88._M_allocated_capacity._4_4_,
                               local_88._M_allocated_capacity._0_4_) + 1);
    }
    bVar3 = Result::good(__return_storage_ptr__);
    if (bVar3) {
      if (this->ndArrayInterpretation == true) {
        local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"Pooling3d","");
        validateInputOutputRankEquality((Result *)local_a0,layer,&local_50,&this->blobNameToRank);
        __return_storage_ptr__->m_type = local_a0._0_4_;
        __return_storage_ptr__->m_reason = local_a0._4_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_p != &local_88) {
          operator_delete(local_98._M_p,
                          CONCAT44(local_88._M_allocated_capacity._4_4_,
                                   local_88._M_allocated_capacity._0_4_) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          return __return_storage_ptr__;
        }
        local_c8 = (undefined1  [8])local_b8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_c8,"Pooling3d","");
        validateRankCount((Result *)local_a0,layer,(string *)local_c8,5,-1,&this->blobNameToRank);
        __return_storage_ptr__->m_type = local_a0._0_4_;
        __return_storage_ptr__->m_reason = local_a0._4_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_98);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_p != &local_88) {
          operator_delete(local_98._M_p,
                          CONCAT44(local_88._M_allocated_capacity._4_4_,
                                   local_88._M_allocated_capacity._0_4_) + 1);
        }
        if (local_c8 != (undefined1  [8])local_b8) {
          operator_delete((void *)local_c8,local_b8._0_8_ + 1);
        }
        bVar3 = Result::good(__return_storage_ptr__);
        if (!bVar3) {
          return __return_storage_ptr__;
        }
      }
      if (layer->_oneof_case_[0] == 0x5b9) {
        from = layer->layer_;
      }
      else {
        from.pooling3d_ = Specification::Pooling3DLayerParams::default_instance();
      }
      Specification::Pooling3DLayerParams::Pooling3DLayerParams
                ((Pooling3DLayerParams *)local_a0,from.pooling3d_);
      paVar1 = &local_e8.field_2;
      local_e8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Kernel Depth","");
      validatePositive((Result *)local_c8,local_8c,&local_e8);
      __return_storage_ptr__->m_type = local_c8._0_4_;
      __return_storage_ptr__->m_reason = local_c8._4_4_;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
      pcVar2 = local_b8 + 8;
      if (local_c0._M_p != pcVar2) {
        operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != paVar1) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      bVar3 = Result::good(__return_storage_ptr__);
      if (bVar3) {
        local_e8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Kernel Height","");
        validatePositive((Result *)local_c8,local_88._M_allocated_capacity._0_4_,&local_e8);
        __return_storage_ptr__->m_type = local_c8._0_4_;
        __return_storage_ptr__->m_reason = local_c8._4_4_;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
        if (local_c0._M_p != pcVar2) {
          operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
        }
        bVar3 = Result::good(__return_storage_ptr__);
        if (bVar3) {
          local_e8._M_dataplus._M_p = (pointer)paVar1;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Kernel Width","");
          validatePositive((Result *)local_c8,local_88._M_allocated_capacity._4_4_,&local_e8);
          __return_storage_ptr__->m_type = local_c8._0_4_;
          __return_storage_ptr__->m_reason = local_c8._4_4_;
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
          if (local_c0._M_p != pcVar2) {
            operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e8._M_dataplus._M_p != paVar1) {
            operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
          }
          bVar3 = Result::good(__return_storage_ptr__);
          if (bVar3) {
            local_e8._M_dataplus._M_p = (pointer)paVar1;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Stride Depth","");
            validatePositive((Result *)local_c8,local_88._8_4_,&local_e8);
            __return_storage_ptr__->m_type = local_c8._0_4_;
            __return_storage_ptr__->m_reason = local_c8._4_4_;
            std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
            if (local_c0._M_p != pcVar2) {
              operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_e8._M_dataplus._M_p != paVar1) {
              operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
            }
            bVar3 = Result::good(__return_storage_ptr__);
            if (bVar3) {
              local_e8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_e8,"Stride Height","");
              validatePositive((Result *)local_c8,local_88._12_4_,&local_e8);
              __return_storage_ptr__->m_type = local_c8._0_4_;
              __return_storage_ptr__->m_reason = local_c8._4_4_;
              std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
              if (local_c0._M_p != pcVar2) {
                operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_e8._M_dataplus._M_p != paVar1) {
                operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1
                               );
              }
              bVar3 = Result::good(__return_storage_ptr__);
              if (bVar3) {
                local_e8._M_dataplus._M_p = (pointer)paVar1;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_e8,"Stride Width","");
                validatePositive((Result *)local_c8,local_78,&local_e8);
                __return_storage_ptr__->m_type = local_c8._0_4_;
                __return_storage_ptr__->m_reason = local_c8._4_4_;
                std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
                if (local_c0._M_p != pcVar2) {
                  operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_e8._M_dataplus._M_p != paVar1) {
                  operator_delete(local_e8._M_dataplus._M_p,
                                  local_e8.field_2._M_allocated_capacity + 1);
                }
                bVar3 = Result::good(__return_storage_ptr__);
                if (bVar3) {
                  local_e8._M_dataplus._M_p = (pointer)paVar1;
                  std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Front","");
                  validatePooling3dPadding((Result *)local_c8,local_58,local_74,&local_e8);
                  __return_storage_ptr__->m_type = local_c8._0_4_;
                  __return_storage_ptr__->m_reason = local_c8._4_4_;
                  std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
                  if (local_c0._M_p != pcVar2) {
                    operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_e8._M_dataplus._M_p != paVar1) {
                    operator_delete(local_e8._M_dataplus._M_p,
                                    local_e8.field_2._M_allocated_capacity + 1);
                  }
                  bVar3 = Result::good(__return_storage_ptr__);
                  if (bVar3) {
                    local_e8._M_dataplus._M_p = (pointer)paVar1;
                    std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Back","");
                    validatePooling3dPadding((Result *)local_c8,local_58,local_70,&local_e8);
                    __return_storage_ptr__->m_type = local_c8._0_4_;
                    __return_storage_ptr__->m_reason = local_c8._4_4_;
                    std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
                    if (local_c0._M_p != pcVar2) {
                      operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_e8._M_dataplus._M_p != paVar1) {
                      operator_delete(local_e8._M_dataplus._M_p,
                                      local_e8.field_2._M_allocated_capacity + 1);
                    }
                    bVar3 = Result::good(__return_storage_ptr__);
                    if (bVar3) {
                      local_e8._M_dataplus._M_p = (pointer)paVar1;
                      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e8,"Top","");
                      validatePooling3dPadding((Result *)local_c8,local_58,local_6c,&local_e8);
                      __return_storage_ptr__->m_type = local_c8._0_4_;
                      __return_storage_ptr__->m_reason = local_c8._4_4_;
                      std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
                      if (local_c0._M_p != pcVar2) {
                        operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_e8._M_dataplus._M_p != paVar1) {
                        operator_delete(local_e8._M_dataplus._M_p,
                                        local_e8.field_2._M_allocated_capacity + 1);
                      }
                      bVar3 = Result::good(__return_storage_ptr__);
                      if (bVar3) {
                        local_e8._M_dataplus._M_p = (pointer)paVar1;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_e8,"Bottom","");
                        validatePooling3dPadding((Result *)local_c8,local_58,local_68,&local_e8);
                        __return_storage_ptr__->m_type = local_c8._0_4_;
                        __return_storage_ptr__->m_reason = local_c8._4_4_;
                        std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
                        if (local_c0._M_p != pcVar2) {
                          operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_e8._M_dataplus._M_p != paVar1) {
                          operator_delete(local_e8._M_dataplus._M_p,
                                          local_e8.field_2._M_allocated_capacity + 1);
                        }
                        bVar3 = Result::good(__return_storage_ptr__);
                        if (bVar3) {
                          local_e8._M_dataplus._M_p = (pointer)paVar1;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_e8,"Left","");
                          validatePooling3dPadding((Result *)local_c8,local_58,local_64,&local_e8);
                          __return_storage_ptr__->m_type = local_c8._0_4_;
                          __return_storage_ptr__->m_reason = local_c8._4_4_;
                          std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
                          if (local_c0._M_p != pcVar2) {
                            operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_e8._M_dataplus._M_p != paVar1) {
                            operator_delete(local_e8._M_dataplus._M_p,
                                            local_e8.field_2._M_allocated_capacity + 1);
                          }
                          bVar3 = Result::good(__return_storage_ptr__);
                          if (bVar3) {
                            local_e8._M_dataplus._M_p = (pointer)paVar1;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_e8,"Right","");
                            validatePooling3dPadding((Result *)local_c8,local_58,local_60,&local_e8)
                            ;
                            __return_storage_ptr__->m_type = local_c8._0_4_;
                            __return_storage_ptr__->m_reason = local_c8._4_4_;
                            std::__cxx11::string::operator=((string *)this_00,(string *)&local_c0);
                            if (local_c0._M_p != pcVar2) {
                              operator_delete(local_c0._M_p,local_b8._8_8_ + 1);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_e8._M_dataplus._M_p != paVar1) {
                              operator_delete(local_e8._M_dataplus._M_p,
                                              local_e8.field_2._M_allocated_capacity + 1);
                            }
                            Result::good(__return_storage_ptr__);
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      Specification::Pooling3DLayerParams::~Pooling3DLayerParams((Pooling3DLayerParams *)local_a0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validatePooling3dLayer(const Specification::NeuralNetworkLayer& layer) {
    Result r;
    r = validateInputCount(layer, 1, 1);
    if (!r.good()) { return r; }
    
    r = validateOutputCount(layer, 1, 1);
    if (!r.good()) { return r; }
    
    if (ndArrayInterpretation) {
        r = validateInputOutputRankEquality(layer, "Pooling3d", blobNameToRank);
        if (!r.good()) { return r; }
        // Rank 5 for 2 spacial dimensions, 1 temporal dimension, batch dimension, and 1+ channels.
        r = validateRankCount(layer, "Pooling3d", 5, -1, blobNameToRank);
        if (!r.good()) { return r; }
    }
    
    // Kernel
    const auto pooling3d = layer.pooling3d();
   
    r = validatePositive(pooling3d.kerneldepth(), "Kernel Depth");
    if (!r.good()) { return r; }

    r = validatePositive(pooling3d.kernelheight(), "Kernel Height");
    if (!r.good()) { return r; }

    r = validatePositive(pooling3d.kernelwidth(), "Kernel Width");
    if (!r.good()) { return r; }

    // Stride
    r = validatePositive(pooling3d.stridedepth(), "Stride Depth");
    if (!r.good()) { return r; }
    
    r = validatePositive(pooling3d.strideheight(), "Stride Height");
    if (!r.good()) { return r; }
    
    r = validatePositive(pooling3d.stridewidth(), "Stride Width");
    if (!r.good()) { return r; }
    
    // Custom Padding
    auto paddingType = pooling3d.paddingtype();
    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingfront(), "Front");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingback(), "Back");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingtop(), "Top");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingbottom(), "Bottom");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingleft(), "Left");
    if (!r.good()) { return r; }

    r = validatePooling3dPadding(paddingType, pooling3d.custompaddingright(), "Right");
    if (!r.good()) { return r; }
    
    return r;
}